

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

int archive_read_format_7zip_cleanup(archive_read *a)

{
  long in_RDI;
  _7zip *zip;
  _7zip *in_stack_ffffffffffffffe8;
  archive_read *a_00;
  
  a_00 = (archive_read *)**(long **)(in_RDI + 0x948);
  free_StreamsInfo((_7z_stream_info *)0x246f67);
  free((void *)a_00->read_data_output_offset);
  free(*(void **)&a_00->read_data_is_posix_read);
  free_decompression(a_00,in_stack_ffffffffffffffe8);
  free((a_00->client).seeker);
  free(a_00[8].bidders[9].options);
  free(a_00[8].bidders[9].free);
  free(a_00[8].bidders[10].data);
  free(a_00[8].bidders[0xb].name);
  free(a_00);
  **(undefined8 **)(in_RDI + 0x948) = 0;
  return 0;
}

Assistant:

static int
archive_read_format_7zip_cleanup(struct archive_read *a)
{
	struct _7zip *zip;

	zip = (struct _7zip *)(a->format->data);
	free_StreamsInfo(&(zip->si));
	free(zip->entries);
	free(zip->entry_names);
	free_decompression(a, zip);
	free(zip->uncompressed_buffer);
	free(zip->sub_stream_buff[0]);
	free(zip->sub_stream_buff[1]);
	free(zip->sub_stream_buff[2]);
	free(zip->tmp_stream_buff);
	free(zip);
	(a->format->data) = NULL;
	return (ARCHIVE_OK);
}